

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator.c
# Opt level: O1

void * stb_leakcheck_malloc(size_t sz,char *file,char *func,int line)

{
  stb__leakcheck_malloc_info *dst;
  stb__leakcheck_malloc_info *psVar1;
  
  dst = (stb__leakcheck_malloc_info *)malloc(sz + 0xe0);
  if (dst == (stb__leakcheck_malloc_info *)0x0) {
    psVar1 = (stb__leakcheck_malloc_info *)0x0;
  }
  else {
    sx_strcpy((char *)dst,0x80,file);
    sx_strcpy(dst->func,0x40,func);
    LOCK();
    UNLOCK();
    if (mi_lock != 0) {
      do {
      } while( true );
    }
    dst->line = line;
    dst->next = mi_head;
    if (mi_head != (stb__leakcheck_malloc_info *)0x0) {
      mi_head->prev = dst;
    }
    dst->prev = (stb__leakcheck_malloc_info *)0x0;
    dst->size = (long)(int)sz;
    mi_lock = 0;
    psVar1 = dst + 1;
    mi_head = dst;
  }
  return psVar1;
}

Assistant:

static void* stb_leakcheck_malloc(size_t sz, const char* file, const char* func, int line)
{
    stb__leakcheck_malloc_info* mi = (stb__leakcheck_malloc_info*)malloc(sz + sizeof(*mi));
    if (mi == NULL)
        return mi;

    sx_strcpy(mi->file, sizeof(mi->file), file);
    sx_strcpy(mi->func, sizeof(mi->func), func);
    sx_lock(mi_lock) {
        mi->line = line;
        mi->next = mi_head;
        if (mi_head)
            mi->next->prev = mi;
        mi->prev = NULL;
        mi->size = (int)sz;
        mi_head = mi;
    }
    return mi + 1;
}